

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack8to4_int8.h
# Opt level: O0

void ncnn::conv1x1s2_pack8to4_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Option *opt)

{
  long in_RSI;
  long in_RDI;
  int j;
  int i;
  int64_t *outptr;
  int64_t *r0;
  int p;
  Mat bottom_blob_shrinked;
  int tailstep;
  int outh;
  int outw;
  int elempack;
  size_t elemsize;
  int channels;
  int w;
  undefined8 in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  int _c;
  Mat *this;
  undefined4 in_stack_fffffffffffffec0;
  int iVar1;
  int in_stack_fffffffffffffec4;
  Mat *in_stack_fffffffffffffec8;
  Allocator *in_stack_fffffffffffffed0;
  Option *in_stack_ffffffffffffff08;
  Mat *in_stack_ffffffffffffff10;
  Mat *in_stack_ffffffffffffff18;
  Mat *in_stack_ffffffffffffff20;
  long *local_a0;
  int local_98;
  Mat local_88;
  int local_40;
  int local_3c;
  int local_38;
  undefined4 local_34;
  undefined8 local_30;
  int local_28;
  int local_24;
  
  _c = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  iVar1 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  local_24 = *(int *)(in_RDI + 0x2c);
  local_28 = *(int *)(in_RDI + 0x38);
  local_30 = *(undefined8 *)(in_RDI + 0x10);
  local_34 = *(undefined4 *)(in_RDI + 0x18);
  local_38 = *(int *)(in_RSI + 0x2c);
  local_3c = *(int *)(in_RSI + 0x30);
  local_40 = local_24 * 2 + local_38 * -2;
  this = &local_88;
  Mat::Mat(this);
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
              (int)((ulong)this >> 0x20),(int)this,_c,in_stack_fffffffffffffea8,iVar1,
              in_stack_fffffffffffffed0);
  for (local_98 = 0; local_98 < local_28; local_98 = local_98 + 1) {
    Mat::channel(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
    local_a0 = Mat::operator_cast_to_long_((Mat *)&stack0xffffffffffffff18);
    Mat::~Mat((Mat *)0x1d6055);
    Mat::channel(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
    in_stack_ffffffffffffff10 = (Mat *)Mat::operator_cast_to_long_((Mat *)&stack0xfffffffffffffec8);
    Mat::~Mat((Mat *)0x1d6096);
    for (in_stack_fffffffffffffec4 = 0; in_stack_fffffffffffffec4 < local_3c;
        in_stack_fffffffffffffec4 = in_stack_fffffffffffffec4 + 1) {
      for (iVar1 = 0; iVar1 < local_38; iVar1 = iVar1 + 1) {
        in_stack_ffffffffffffff10->data = (void *)*local_a0;
        local_a0 = local_a0 + 2;
        in_stack_ffffffffffffff10 = (Mat *)&in_stack_ffffffffffffff10->refcount;
      }
      local_a0 = local_a0 + local_40;
    }
  }
  conv1x1s1_sgemm_pack8to4_int8_sse
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08);
  Mat::~Mat((Mat *)0x1d61b3);
  return;
}

Assistant:

static void conv1x1s2_pack8to4_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = w - 2 * outw + w;

    Mat bottom_blob_shrinked;
    bottom_blob_shrinked.create(outw, outh, channels, elemsize, elempack, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const int64_t* r0 = bottom_blob.channel(p);
        int64_t* outptr = bottom_blob_shrinked.channel(p);

        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j < outw; j++)
            {
                outptr[0] = r0[0];

                r0 += 2;
                outptr += 1;
            }

            r0 += tailstep;
        }
    }

    conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_shrinked, top_blob, kernel, opt);
}